

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInterface.cpp
# Opt level: O2

void __thiscall
Rml::SystemInterface::JoinPath
          (SystemInterface *this,String *translated_path,String *document_path,String *path)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  char cVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  String local_220;
  String local_200;
  String local_1e0;
  String local_1c0;
  String local_1a0;
  String local_180;
  URL url;
  
  if ((path->_M_string_length == 0) || (*(path->_M_dataplus)._M_p != '/')) {
    cVar5 = (char)path;
    uVar1 = ::std::__cxx11::string::find(cVar5,0x3a);
    uVar2 = ::std::__cxx11::string::find(cVar5,0x2f);
    uVar3 = ::std::__cxx11::string::find(cVar5,0x5c);
    if (uVar2 < uVar3) {
      uVar3 = uVar2;
    }
    if (uVar1 < uVar3) {
      ::std::__cxx11::string::_M_assign((string *)translated_path);
      return;
    }
    ::std::__cxx11::string::_M_assign((string *)translated_path);
    ::std::__cxx11::string::string((string *)&local_180,(string *)translated_path);
    StringUtilities::Replace(&url.url,&local_180,'\\','/');
    ::std::__cxx11::string::operator=((string *)translated_path,(string *)&url);
    ::std::__cxx11::string::~string((string *)&url);
    ::std::__cxx11::string::~string((string *)&local_180);
    lVar4 = ::std::__cxx11::string::rfind((char)translated_path,0x2f);
    if (lVar4 == -1) {
      translated_path->_M_string_length = 0;
      *(translated_path->_M_dataplus)._M_p = '\0';
    }
    else {
      ::std::__cxx11::string::resize((ulong)translated_path);
    }
    ::std::__cxx11::string::string((string *)&local_1a0,(string *)translated_path);
    StringUtilities::Replace(&local_1c0,&local_1a0,':','|');
    ::std::__cxx11::string::string((string *)&local_200,(string *)path);
    StringUtilities::Replace(&local_1e0,&local_200,'\\','/');
    ::std::operator+(&local_240,&local_1c0,&local_1e0);
    URL::URL(&url,&local_240);
    ::std::__cxx11::string::~string((string *)&local_240);
    ::std::__cxx11::string::~string((string *)&local_1e0);
    ::std::__cxx11::string::~string((string *)&local_200);
    ::std::__cxx11::string::~string((string *)&local_1c0);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    URL::GetPathedFileName_abi_cxx11_(&local_220,&url);
    StringUtilities::Replace(&local_240,&local_220,'|',':');
    ::std::__cxx11::string::operator=((string *)translated_path,(string *)&local_240);
    ::std::__cxx11::string::~string((string *)&local_240);
    ::std::__cxx11::string::~string((string *)&local_220);
    URL::~URL(&url);
  }
  else {
    ::std::__cxx11::string::substr((ulong)&url,(ulong)path);
    ::std::__cxx11::string::operator=((string *)translated_path,(string *)&url);
    ::std::__cxx11::string::~string((string *)&url);
  }
  return;
}

Assistant:

void SystemInterface::JoinPath(String& translated_path, const String& document_path, const String& path)
{
	// If the path is absolute, strip the leading / and return it.
	if (path.size() > 0 && path[0] == '/')
	{
		translated_path = path.substr(1);
		return;
	}

	// If the path is a Windows-style absolute path, return it directly.
	size_t drive_pos = path.find(':');
	size_t slash_pos = Math::Min(path.find('/'), path.find('\\'));
	if (drive_pos != String::npos && drive_pos < slash_pos)
	{
		translated_path = path;
		return;
	}

	using StringUtilities::Replace;

	// Strip off the referencing document name.
	translated_path = document_path;
	translated_path = Replace(translated_path, '\\', '/');
	size_t file_start = translated_path.rfind('/');
	if (file_start != String::npos)
		translated_path.resize(file_start + 1);
	else
		translated_path.clear();

	// Append the paths and send through URL to removing any '..'.
	URL url(Replace(translated_path, ':', '|') + Replace(path, '\\', '/'));
	translated_path = Replace(url.GetPathedFileName(), '|', ':');
}